

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructCmpxchg
          (InternalAnalyzer *this,StructCmpxchg *curr)

{
  bool bVar1;
  StructCmpxchg *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->readsMutableStruct = true;
    this->parent->writesStruct = true;
    bVar1 = wasm::Type::isNullable(&curr->ref->type);
    if (bVar1) {
      this->parent->implicitTrap = true;
    }
    if (curr->order == Unordered) {
      __assert_fail("curr->order != MemoryOrder::Unordered",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x39d,
                    "void wasm::EffectAnalyzer::InternalAnalyzer::visitStructCmpxchg(StructCmpxchg *)"
                   );
    }
    this->parent->isAtomic = true;
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsMutableStruct = true;
      parent.writesStruct = true;
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      assert(curr->order != MemoryOrder::Unordered);
      parent.isAtomic = true;
    }